

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O0

void xmlXPtrRangeFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathObjectPtr *ppxVar1;
  xmlXPathObjectPtr pxVar2;
  xmlLocationSetPtr val;
  xmlXPathObjectPtr tmp;
  xmlLocationSetPtr newset;
  xmlLocationSetPtr oldset;
  xmlXPathObjectPtr set;
  int i;
  int nargs_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if (ctxt != (xmlXPathParserContextPtr)0x0) {
    if (nargs == 1) {
      if (ctxt->valueNr < ctxt->valueFrame + 1) {
        xmlXPathErr(ctxt,0x17);
      }
      else if ((ctxt->value == (xmlXPathObjectPtr)0x0) ||
              ((ctxt->value->type != XPATH_LOCATIONSET && (ctxt->value->type != XPATH_NODESET)))) {
        xmlXPathErr(ctxt,0xb);
      }
      else {
        pxVar2 = valuePop(ctxt);
        oldset = (xmlLocationSetPtr)pxVar2;
        if (pxVar2->type == XPATH_NODESET) {
          oldset = (xmlLocationSetPtr)xmlXPtrNewLocationSetNodeSet(pxVar2->nodesetval);
          xmlXPathFreeObject(pxVar2);
          if ((xmlXPathObjectPtr)oldset == (xmlXPathObjectPtr)0x0) {
            xmlXPathErr(ctxt,0xf);
            return;
          }
        }
        ppxVar1 = oldset[2].locTab;
        val = xmlXPtrLocationSetCreate((xmlXPathObjectPtr)0x0);
        if (val == (xmlLocationSetPtr)0x0) {
          xmlXPathFreeObject((xmlXPathObjectPtr)oldset);
          xmlXPathErr(ctxt,0xf);
        }
        else {
          if (ppxVar1 != (xmlXPathObjectPtr *)0x0) {
            for (set._0_4_ = 0; (int)set < *(int *)ppxVar1; set._0_4_ = (int)set + 1) {
              pxVar2 = xmlXPtrCoveringRange
                                 (ctxt,*(xmlXPathObjectPtr *)
                                        (&ppxVar1[1]->type + (long)(int)set * 2));
              xmlXPtrLocationSetAdd(val,pxVar2);
            }
          }
          pxVar2 = xmlXPtrWrapLocationSet(val);
          valuePush(ctxt,pxVar2);
          xmlXPathFreeObject((xmlXPathObjectPtr)oldset);
        }
      }
    }
    else {
      xmlXPathErr(ctxt,0xc);
    }
  }
  return;
}

Assistant:

static void
xmlXPtrRangeFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    int i;
    xmlXPathObjectPtr set;
    xmlLocationSetPtr oldset;
    xmlLocationSetPtr newset;

    CHECK_ARITY(1);
    if ((ctxt->value == NULL) ||
	((ctxt->value->type != XPATH_LOCATIONSET) &&
	 (ctxt->value->type != XPATH_NODESET)))
        XP_ERROR(XPATH_INVALID_TYPE)

    set = valuePop(ctxt);
    if (set->type == XPATH_NODESET) {
	xmlXPathObjectPtr tmp;

	/*
	 * First convert to a location set
	 */
	tmp = xmlXPtrNewLocationSetNodeSet(set->nodesetval);
	xmlXPathFreeObject(set);
	if (tmp == NULL)
            XP_ERROR(XPATH_MEMORY_ERROR)
	set = tmp;
    }
    oldset = (xmlLocationSetPtr) set->user;

    /*
     * The loop is to compute the covering range for each item and add it
     */
    newset = xmlXPtrLocationSetCreate(NULL);
    if (newset == NULL) {
	xmlXPathFreeObject(set);
        XP_ERROR(XPATH_MEMORY_ERROR);
    }
    if (oldset != NULL) {
        for (i = 0;i < oldset->locNr;i++) {
            xmlXPtrLocationSetAdd(newset,
                    xmlXPtrCoveringRange(ctxt, oldset->locTab[i]));
        }
    }

    /*
     * Save the new value and cleanup
     */
    valuePush(ctxt, xmlXPtrWrapLocationSet(newset));
    xmlXPathFreeObject(set);
}